

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O3

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyAlias
          (UnicodeSet *this,UnicodeString *prop,UnicodeString *value,UErrorCode *ec)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  UProperty UVar6;
  int32_t iVar7;
  UProperty property;
  UChar32 UVar8;
  int32_t iVar9;
  UnicodeSet *pUVar10;
  int32_t dstCapacity;
  char16_t *pcVar11;
  double dVar12;
  UVersionInfo version;
  CharString vname;
  CharString pname;
  char buf [128];
  double local_140;
  CharString local_138;
  CharString local_f8;
  char *local_b8 [17];
  
  if (U_ZERO_ERROR < *ec) {
    return this;
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) {
    return this;
  }
  uVar1 = (prop->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar11 = (prop->fUnion).fFields.fArray;
    }
    else {
      pcVar11 = (prop->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    pcVar11 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar7 = (prop->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)(short)uVar1 >> 5;
  }
  UVar4 = uprv_isInvariantUString_63(pcVar11,iVar7);
  if (UVar4 == '\0') {
LAB_002dff5c:
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  uVar1 = (value->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar11 = (value->fUnion).fFields.fArray;
    }
    else {
      pcVar11 = (value->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    pcVar11 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar7 = (value->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)(short)uVar1 >> 5;
  }
  UVar4 = uprv_isInvariantUString_63(pcVar11,iVar7);
  if (UVar4 == '\0') goto LAB_002dff5c;
  MaybeStackArray<char,_40>::MaybeStackArray(&local_f8.buffer);
  local_f8.len = 0;
  *local_f8.buffer.ptr = '\0';
  MaybeStackArray<char,_40>::MaybeStackArray(&local_138.buffer);
  local_138.len = 0;
  *local_138.buffer.ptr = '\0';
  CharString::appendInvariantChars(&local_f8,prop,ec);
  CharString::appendInvariantChars(&local_138,value,ec);
  if (U_ZERO_ERROR < *ec) goto LAB_002e02ab;
  sVar2 = (value->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar5 = (value->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar2 >> 5;
  }
  if (iVar5 < 1) {
    iVar7 = u_getPropertyValueEnum_63(UCHAR_GENERAL_CATEGORY_MASK,local_f8.buffer.ptr);
    bVar3 = true;
    property = UCHAR_GENERAL_CATEGORY_MASK;
    if (iVar7 == -1) {
      iVar7 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,local_f8.buffer.ptr);
      if (iVar7 == -1) {
        property = u_getPropertyEnum_63(local_f8.buffer.ptr);
        iVar7 = 1;
        if (0x40 < (uint)property) {
          iVar9 = uprv_compareASCIIPropertyNames_63("ANY",local_f8.buffer.ptr);
          if (iVar9 == 0) {
            UVar8 = 0x10ffff;
          }
          else {
            iVar9 = uprv_compareASCIIPropertyNames_63("ASCII",local_f8.buffer.ptr);
            if (iVar9 != 0) {
              iVar9 = uprv_compareASCIIPropertyNames_63("Assigned",local_f8.buffer.ptr);
              if (iVar9 != 0) goto LAB_002e02a4;
              bVar3 = false;
              property = UCHAR_GENERAL_CATEGORY_MASK;
              goto LAB_002e0074;
            }
            UVar8 = 0x7f;
          }
          set(this,0,UVar8);
          goto LAB_002e02ab;
        }
      }
      else {
        property = UCHAR_SCRIPT;
      }
    }
    goto LAB_002e0074;
  }
  UVar6 = u_getPropertyEnum_63(local_f8.buffer.ptr);
  if (UVar6 != UCHAR_INVALID_CODE) {
    property = UCHAR_GENERAL_CATEGORY_MASK;
    if (UVar6 != UCHAR_GENERAL_CATEGORY) {
      property = UVar6;
    }
    if (((property == UCHAR_GENERAL_CATEGORY_MASK) || ((uint)property < 0x41)) ||
       ((uint)(property + 0xfffff000) < 0x19)) {
      iVar7 = u_getPropertyValueEnum_63(property,local_138.buffer.ptr);
      bVar3 = true;
      if (iVar7 != -1) {
LAB_002e0074:
        applyIntPropertyValue(this,property,iVar7,ec);
        if (!bVar3) {
          complement(this);
        }
        if (((this->fFlags & 1) != 0) && (*ec < U_ILLEGAL_ARGUMENT_ERROR)) {
          *ec = U_MEMORY_ALLOCATION_ERROR;
        }
        goto LAB_002e02ab;
      }
      if ((((uint)(UVar6 + ~UCHAR_BLOCK) < 0x10) &&
          ((0xc001U >> (UVar6 + ~UCHAR_BLOCK & 0x1fU) & 1) != 0)) &&
         ((dVar12 = strtod(local_138.buffer.ptr,local_b8), *local_b8[0] == '\0' &&
          ((0.0 <= dVar12 && (dVar12 <= 255.0)))))) {
        if ((dVar12 == (double)(int)dVar12) && (!NAN(dVar12) && !NAN((double)(int)dVar12))) {
          iVar7 = (int32_t)dVar12;
          property = UVar6;
          goto LAB_002e0074;
        }
      }
    }
    else if (UVar6 < UCHAR_NAME) {
      if (UVar6 == UCHAR_DOUBLE_START) {
        local_140 = strtod(local_138.buffer.ptr,local_b8);
        if (*local_b8[0] == '\0') {
          pUVar10 = CharacterProperties::getInclusionsForProperty(UCHAR_DOUBLE_START,ec);
          applyFilter(this,anon_unknown_0::numericValueFilter,&local_140,pUVar10,ec);
          goto LAB_002e02ab;
        }
      }
      else if ((UVar6 == UCHAR_AGE) &&
              (UVar4 = anon_unknown_0::mungeCharName
                                 ((char *)local_b8,local_138.buffer.ptr,dstCapacity), UVar4 != '\0')
              ) {
        u_versionFromString_63((uint8_t *)&local_140,(char *)local_b8);
        pUVar10 = CharacterProperties::getInclusionsForProperty(UCHAR_AGE,ec);
        applyFilter(this,anon_unknown_0::versionFilter,&local_140,pUVar10,ec);
        goto LAB_002e02ab;
      }
    }
    else if (UVar6 == UCHAR_NAME) {
      UVar4 = anon_unknown_0::mungeCharName((char *)local_b8,local_138.buffer.ptr,dstCapacity);
      if ((UVar4 != '\0') &&
         (UVar8 = u_charFromName_63(U_EXTENDED_CHAR_NAME,(char *)local_b8,ec),
         *ec < U_ILLEGAL_ARGUMENT_ERROR)) {
        clear(this);
        add(this,UVar8);
        goto LAB_002e02ab;
      }
    }
    else if (((UVar6 != UCHAR_UNICODE_1_NAME) && (UVar6 == UCHAR_OTHER_PROPERTY_START)) &&
            (iVar7 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,local_138.buffer.ptr), iVar7 != -1)) {
      bVar3 = true;
      property = UCHAR_OTHER_PROPERTY_START;
      goto LAB_002e0074;
    }
  }
LAB_002e02a4:
  *ec = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002e02ab:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_138.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_f8.buffer);
  return this;
}

Assistant:

UnicodeSet&
UnicodeSet::applyPropertyAlias(const UnicodeString& prop,
                               const UnicodeString& value,
                               UErrorCode& ec) {
    if (U_FAILURE(ec) || isFrozen()) return *this;

    // prop and value used to be converted to char * using the default
    // converter instead of the invariant conversion.
    // This should not be necessary because all Unicode property and value
    // names use only invariant characters.
    // If there are any variant characters, then we won't find them anyway.
    // Checking first avoids assertion failures in the conversion.
    if( !uprv_isInvariantUString(prop.getBuffer(), prop.length()) ||
        !uprv_isInvariantUString(value.getBuffer(), value.length())
    ) {
        FAIL(ec);
    }
    CharString pname, vname;
    pname.appendInvariantChars(prop, ec);
    vname.appendInvariantChars(value, ec);
    if (U_FAILURE(ec)) return *this;

    UProperty p;
    int32_t v;
    UBool invert = FALSE;

    if (value.length() > 0) {
        p = u_getPropertyEnum(pname.data());
        if (p == UCHAR_INVALID_CODE) FAIL(ec);

        // Treat gc as gcm
        if (p == UCHAR_GENERAL_CATEGORY) {
            p = UCHAR_GENERAL_CATEGORY_MASK;
        }

        if ((p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) ||
            (p >= UCHAR_INT_START && p < UCHAR_INT_LIMIT) ||
            (p >= UCHAR_MASK_START && p < UCHAR_MASK_LIMIT)) {
            v = u_getPropertyValueEnum(p, vname.data());
            if (v == UCHAR_INVALID_CODE) {
                // Handle numeric CCC
                if (p == UCHAR_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_TRAIL_CANONICAL_COMBINING_CLASS ||
                    p == UCHAR_LEAD_CANONICAL_COMBINING_CLASS) {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    // Anything between 0 and 255 is valid even if unused.
                    // Cast double->int only after range check.
                    // We catch NaN here because comparing it with both 0 and 255 will be false
                    // (as are all comparisons with NaN).
                    if (*end != 0 || !(0 <= val && val <= 255) ||
                            (v = (int32_t)val) != val) {
                        // non-integral value or outside 0..255, or trailing junk
                        FAIL(ec);
                    }
                } else {
                    FAIL(ec);
                }
            }
        }

        else {

            switch (p) {
            case UCHAR_NUMERIC_VALUE:
                {
                    char* end;
                    double val = uprv_strtod(vname.data(), &end);
                    if (*end != 0) {
                        FAIL(ec);
                    }
                    applyFilter(numericValueFilter, &val,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_NAME:
                {
                    // Must munge name, since u_charFromName() does not do
                    // 'loose' matching.
                    char buf[128]; // it suffices that this be > uprv_getMaxCharNameLength
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UChar32 ch = u_charFromName(U_EXTENDED_CHAR_NAME, buf, &ec);
                    if (U_SUCCESS(ec)) {
                        clear();
                        add(ch);
                        return *this;
                    } else {
                        FAIL(ec);
                    }
                }
            case UCHAR_UNICODE_1_NAME:
                // ICU 49 deprecates the Unicode_1_Name property APIs.
                FAIL(ec);
            case UCHAR_AGE:
                {
                    // Must munge name, since u_versionFromString() does not do
                    // 'loose' matching.
                    char buf[128];
                    if (!mungeCharName(buf, vname.data(), sizeof(buf))) FAIL(ec);
                    UVersionInfo version;
                    u_versionFromString(version, buf);
                    applyFilter(versionFilter, &version,
                                CharacterProperties::getInclusionsForProperty(p, ec), ec);
                    return *this;
                }
            case UCHAR_SCRIPT_EXTENSIONS:
                v = u_getPropertyValueEnum(UCHAR_SCRIPT, vname.data());
                if (v == UCHAR_INVALID_CODE) {
                    FAIL(ec);
                }
                // fall through to calling applyIntPropertyValue()
                break;
            default:
                // p is a non-binary, non-enumerated property that we
                // don't support (yet).
                FAIL(ec);
            }
        }
    }

    else {
        // value is empty.  Interpret as General Category, Script, or
        // Binary property.
        p = UCHAR_GENERAL_CATEGORY_MASK;
        v = u_getPropertyValueEnum(p, pname.data());
        if (v == UCHAR_INVALID_CODE) {
            p = UCHAR_SCRIPT;
            v = u_getPropertyValueEnum(p, pname.data());
            if (v == UCHAR_INVALID_CODE) {
                p = u_getPropertyEnum(pname.data());
                if (p >= UCHAR_BINARY_START && p < UCHAR_BINARY_LIMIT) {
                    v = 1;
                } else if (0 == uprv_comparePropertyNames(ANY, pname.data())) {
                    set(MIN_VALUE, MAX_VALUE);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASCII, pname.data())) {
                    set(0, 0x7F);
                    return *this;
                } else if (0 == uprv_comparePropertyNames(ASSIGNED, pname.data())) {
                    // [:Assigned:]=[:^Cn:]
                    p = UCHAR_GENERAL_CATEGORY_MASK;
                    v = U_GC_CN_MASK;
                    invert = TRUE;
                } else {
                    FAIL(ec);
                }
            }
        }
    }

    applyIntPropertyValue(p, v, ec);
    if(invert) {
        complement();
    }

    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}